

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::Snapshot::SetCurrentSourceDirectory(Snapshot *this,string *dir)

{
  PointerType pSVar1;
  PointerType path;
  PointerType pBVar2;
  string local_40;
  
  if (this->State != (cmState *)0x0) {
    pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
    path = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar1->BuildSystemDirectory);
    std::__cxx11::string::_M_assign((string *)path);
    cmsys::SystemTools::ConvertToUnixSlashes(&path->Location);
    cmsys::SystemTools::CollapseFullPath(&local_40,&path->Location);
    std::__cxx11::string::operator=((string *)path,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
    pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar1->BuildSystemDirectory);
    cmsys::SystemTools::SplitPath(&path->Location,&pBVar2->CurrentSourceDirectoryComponents,true);
    ComputeRelativePathTopSource(this);
    return;
  }
  __assert_fail("this->State",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmState.cxx"
                ,0x2cb,"void cmState::Snapshot::SetCurrentSourceDirectory(const std::string &)");
}

Assistant:

void cmState::Snapshot::SetCurrentSourceDirectory(std::string const& dir)
{
  assert(this->State);
  std::string& loc = this->Position->BuildSystemDirectory->Location;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  cmSystemTools::SplitPath(
      loc,
      this->Position->BuildSystemDirectory->CurrentSourceDirectoryComponents);
  this->ComputeRelativePathTopSource();
}